

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O1

int grisu3_i_to_str(int val,char *str)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  
  iVar6 = (int)str;
  if (val < 0) {
    *str = '-';
    val = -val;
    str = str + 1;
  }
  uVar5 = 0;
  do {
    uVar4 = (uint)val / 10;
    if ((uint)val < 10) {
      uVar4 = val;
    }
    str[uVar5] = (char)((uint)val / 10) * -10 + (char)val + '0';
    uVar5 = uVar5 + 1;
    bVar2 = 9 < (uint)val;
    val = uVar4;
  } while (bVar2);
  str[uVar5] = '\0';
  uVar4 = (uint)uVar5;
  if (1 < (int)uVar4) {
    lVar3 = (ulong)(uVar4 & 0x7fffffff) - 1;
    lVar7 = 0;
    pcVar8 = str;
    do {
      cVar1 = *pcVar8;
      *pcVar8 = str[lVar7 + lVar3];
      str[lVar7 + lVar3] = cVar1;
      pcVar8 = pcVar8 + 1;
      lVar7 = lVar7 + -1;
    } while (-lVar7 != (ulong)((uint)(uVar5 >> 1) & 0x3fffffff));
  }
  return uVar4 + ((int)str - iVar6);
}

Assistant:

static int grisu3_i_to_str(int val, char *str)
{
    int len, i;
    char *s;
    char *begin = str;
    if (val < 0) { *str++ = '-'; val = -val; }
    s = str;

    for(;;)
    {
        int ni = val / 10;
        int digit = val - ni*10;
        *s++ = (char)('0' + digit);
        if (ni == 0)
            break;
        val = ni;
    }
    *s = '\0';
    len = (int)(s - str);
    for(i = 0; i < len/2; ++i)
    {
        char ch = str[i];
        str[i] = str[len-1-i];
        str[len-1-i] = ch;
    }

    return (int)(s - begin);
}